

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  int iVar1;
  FILE *__stream;
  size_type __new_size;
  size_t sVar2;
  char *__s;
  string local_50;
  undefined1 local_30 [8];
  string_view filename_local;
  
  filename_local.data_ = filename.data_;
  local_30 = (undefined1  [8])this;
  string_view::to_string_abi_cxx11_(&local_50,(string_view *)local_30);
  __stream = fopen(local_50._M_dataplus._M_p,"rb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (__stream == (FILE *)0x0) {
    ReadFile((wabt *)local_30);
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 < 0) {
      __s = "fseek to end failed";
    }
    else {
      __new_size = ftell(__stream);
      if ((long)__new_size < 0) {
        __s = "ftell failed";
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 < 0) {
          __s = "fseek to beginning failed";
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename.size_,
                     __new_size);
          if ((__new_size == 0) ||
             (sVar2 = fread((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             filename.size_)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start,__new_size,1,__stream),
             sVar2 == 1)) {
            fclose(__stream);
            return (Result)Ok;
          }
          __s = "fread failed";
        }
      }
    }
    perror(__s);
    fclose(__stream);
  }
  return (Result)Error;
}

Assistant:

Result ReadFile(string_view filename, std::vector<uint8_t>* out_data) {
  FILE* infile = fopen(filename.to_string().c_str(), "rb");
  if (!infile) {
    const char format[] = "unable to read file %s";
    char msg[PATH_MAX + sizeof(format)];
    wabt_snprintf(msg, sizeof(msg), format, filename.to_string().c_str());
    perror(msg);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    perror("fseek to end failed");
    fclose(infile);
    return Result::Error;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    perror("fread failed");
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}